

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subdiv.c
# Opt level: O3

REF_STATUS ref_subdiv_new_node(REF_SUBDIV ref_subdiv)

{
  REF_GRID ref_grid;
  REF_EDGE ref_edge;
  REF_DBL *pRVar1;
  undefined1 auVar2 [16];
  REF_NODE pRVar3;
  uint uVar4;
  REF_GLOB *data;
  REF_INT *pRVar5;
  REF_DBL *pRVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  undefined8 uVar10;
  REF_MPI pRVar11;
  char *pcVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  int iVar18;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  int iVar22;
  REF_INT node;
  REF_INT part;
  REF_GLOB global;
  int local_7c;
  REF_NODE local_78;
  int local_6c;
  REF_DBL *local_68;
  REF_MPI local_60;
  REF_DBL *local_58;
  REF_GLOB *local_50;
  REF_INT *local_48;
  REF_GEOM local_40;
  REF_GLOB local_38;
  
  ref_grid = ref_subdiv->grid;
  ref_edge = ref_subdiv->edge;
  local_60 = ref_grid->mpi;
  local_78 = ref_grid->node;
  local_40 = ref_grid->geom;
  iVar18 = ref_edge->n;
  if (0 < iVar18) {
    lVar14 = 0;
    do {
      if ((ref_subdiv->mark[lVar14] == 0) && (iVar22 = ref_subdiv->node[lVar14], iVar22 != -1)) {
        local_7c = iVar22;
        uVar4 = ref_geom_remove_all(local_40,iVar22);
        if (uVar4 != 0) {
          pcVar12 = "remove geom from node";
          uVar10 = 0x390;
          goto LAB_00210543;
        }
        uVar4 = ref_edge_part(ref_edge,(REF_INT)lVar14,&local_6c);
        if (uVar4 != 0) {
          pcVar12 = "edge part";
          uVar10 = 0x391;
          goto LAB_00210543;
        }
        if (local_60->id == local_6c) {
          uVar4 = ref_node_remove(local_78,local_7c);
          if (uVar4 != 0) {
            pcVar12 = "owned, rm node with global";
            uVar10 = 0x393;
            goto LAB_00210543;
          }
        }
        else {
          uVar4 = ref_node_remove_without_global(local_78,local_7c);
          if (uVar4 != 0) {
            pcVar12 = "ghost, rm node without global";
            uVar10 = 0x396;
            goto LAB_00210543;
          }
        }
        ref_subdiv->node[lVar14] = -1;
        iVar18 = ref_edge->n;
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < iVar18);
  }
  pRVar3 = local_78;
  uVar4 = ref_node_synchronize_globals(local_78);
  if (uVar4 != 0) {
    pcVar12 = "sync glob";
    uVar10 = 0x39c;
    goto LAB_00210543;
  }
  if (0 < ref_edge->n) {
    lVar14 = 0;
    do {
      if ((ref_subdiv->mark[lVar14] != 0) && (ref_subdiv->node[lVar14] == -1)) {
        uVar4 = ref_edge_part(ref_edge,(REF_INT)lVar14,&local_6c);
        if (uVar4 != 0) {
          pcVar12 = "edge part";
          uVar10 = 0x3a1;
          goto LAB_00210543;
        }
        if (local_60->id == local_6c) {
          uVar4 = ref_node_next_global(pRVar3,&local_38);
          if (uVar4 != 0) {
            pcVar12 = "next global";
            uVar10 = 0x3a3;
            goto LAB_00210543;
          }
          uVar4 = ref_node_add(pRVar3,local_38,&local_7c);
          if (uVar4 != 0) {
            pcVar12 = "add node";
            uVar10 = 0x3a4;
            goto LAB_00210543;
          }
          ref_subdiv->node[lVar14] = local_7c;
          uVar4 = ref_node_interpolate_edge
                            (pRVar3,ref_edge->e2n[lVar14 * 2],ref_edge->e2n[lVar14 * 2 + 1],0.5,
                             local_7c);
          if (uVar4 != 0) {
            pcVar12 = "new node";
            uVar10 = 0x3a9;
            goto LAB_00210543;
          }
          uVar4 = ref_geom_add_between
                            (ref_grid,ref_edge->e2n[lVar14 * 2],ref_edge->e2n[lVar14 * 2 + 1],0.5,
                             local_7c);
          if (uVar4 != 0) {
            pcVar12 = "new node";
            uVar10 = 0x3ac;
            goto LAB_00210543;
          }
          uVar4 = ref_geom_constrain(ref_grid,local_7c);
          if (uVar4 != 0) {
            pcVar12 = "geom constraint";
            uVar10 = 0x3ad;
            goto LAB_00210543;
          }
          uVar4 = ref_metric_interpolate_between
                            (ref_grid,ref_edge->e2n[lVar14 * 2],ref_edge->e2n[lVar14 * 2 + 1],
                             local_7c);
          if (uVar4 != 0) {
            pcVar12 = "interp new metric";
            uVar10 = 0x3b1;
            goto LAB_00210543;
          }
        }
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < ref_edge->n);
  }
  uVar4 = ref_node_shift_new_globals(pRVar3);
  if (uVar4 != 0) {
    pcVar12 = "shift glob";
    uVar10 = 0x3b6;
    goto LAB_00210543;
  }
  uVar4 = ref_edge->n;
  uVar13 = (ulong)uVar4;
  if ((int)uVar4 < 0) {
    pcVar12 = "malloc edge_global of REF_GLOB negative";
    uVar10 = 0x3b8;
LAB_00210135:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",uVar10
           ,"ref_subdiv_new_node",pcVar12);
    return 1;
  }
  data = (REF_GLOB *)malloc(uVar13 * 8);
  if (data == (REF_GLOB *)0x0) {
    pcVar12 = "malloc edge_global of REF_GLOB NULL";
    uVar10 = 0x3b8;
LAB_002102cb:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",uVar10
           ,"ref_subdiv_new_node",pcVar12);
    return 2;
  }
  if (uVar13 != 0) {
    memset(data,0xff,uVar13 * 8);
  }
  pRVar5 = (REF_INT *)malloc(uVar13 * 4);
  auVar2 = _DAT_0022ccb0;
  if (pRVar5 == (REF_INT *)0x0) {
    pcVar12 = "malloc edge_part of REF_INT NULL";
    uVar10 = 0x3b9;
    goto LAB_002102cb;
  }
  if (uVar13 != 0) {
    lVar14 = uVar13 - 1;
    auVar16._8_4_ = (int)lVar14;
    auVar16._0_8_ = lVar14;
    auVar16._12_4_ = (int)((ulong)lVar14 >> 0x20);
    uVar8 = 0;
    auVar16 = auVar16 ^ _DAT_0022ccb0;
    auVar20 = _DAT_0022ccd0;
    auVar19 = _DAT_0022cca0;
    do {
      auVar21 = auVar19 ^ auVar2;
      iVar18 = auVar16._4_4_;
      if ((bool)(~(auVar21._4_4_ == iVar18 && auVar16._0_4_ < auVar21._0_4_ ||
                  iVar18 < auVar21._4_4_) & 1)) {
        pRVar5[uVar8] = -1;
      }
      if ((auVar21._12_4_ != auVar16._12_4_ || auVar21._8_4_ <= auVar16._8_4_) &&
          auVar21._12_4_ <= auVar16._12_4_) {
        pRVar5[uVar8 + 1] = -1;
      }
      auVar21 = auVar20 ^ auVar2;
      iVar22 = auVar21._4_4_;
      if (iVar22 <= iVar18 && (iVar22 != iVar18 || auVar21._0_4_ <= auVar16._0_4_)) {
        pRVar5[uVar8 + 2] = -1;
        pRVar5[uVar8 + 3] = -1;
      }
      uVar8 = uVar8 + 4;
      lVar14 = auVar19._8_8_;
      auVar19._0_8_ = auVar19._0_8_ + 4;
      auVar19._8_8_ = lVar14 + 4;
      lVar14 = auVar20._8_8_;
      auVar20._0_8_ = auVar20._0_8_ + 4;
      auVar20._8_8_ = lVar14 + 4;
    } while ((uVar4 + 3 & 0xfffffffc) != uVar8);
  }
  pRVar6 = (REF_DBL *)malloc(uVar13 * 0x78);
  auVar2 = _DAT_0022ccb0;
  if (pRVar6 == (REF_DBL *)0x0) {
    pcVar12 = "malloc edge_real of REF_DBL NULL";
    uVar10 = 0x3bb;
    goto LAB_002102cb;
  }
  if (uVar13 != 0) {
    lVar14 = (uVar13 * 0xf & 0xffffffff) - 1;
    auVar17._8_4_ = (int)lVar14;
    auVar17._0_8_ = lVar14;
    auVar17._12_4_ = (int)((ulong)lVar14 >> 0x20);
    uVar8 = 0;
    auVar17 = auVar17 ^ _DAT_0022ccb0;
    auVar21 = _DAT_0022cca0;
    do {
      auVar20 = auVar21 ^ auVar2;
      if ((bool)(~(auVar20._4_4_ == auVar17._4_4_ && auVar17._0_4_ < auVar20._0_4_ ||
                  auVar17._4_4_ < auVar20._4_4_) & 1)) {
        pRVar6[uVar8] = -999.0;
      }
      if ((auVar20._12_4_ != auVar17._12_4_ || auVar20._8_4_ <= auVar17._8_4_) &&
          auVar20._12_4_ <= auVar17._12_4_) {
        pRVar6[uVar8 + 1] = -999.0;
      }
      uVar8 = uVar8 + 2;
      lVar14 = auVar21._8_8_;
      auVar21._0_8_ = auVar21._0_8_ + 2;
      auVar21._8_8_ = lVar14 + 2;
    } while (((int)(uVar13 * 0xf) + 1U & 0xfffffffe) != uVar8);
  }
  local_58 = pRVar6;
  local_48 = pRVar5;
  if (local_78->naux < 1) {
    local_68 = (REF_DBL *)0x0;
    if (uVar13 != 0) {
LAB_002102f3:
      lVar15 = 0;
      lVar14 = 0;
      pRVar6 = local_58;
      local_50 = data;
      do {
        local_7c = ref_subdiv->node[lVar14];
        if (local_7c != -1) {
          uVar4 = ref_edge_part(ref_edge,(REF_INT)lVar14,&local_6c);
          if (uVar4 != 0) {
            pcVar12 = "edge part";
            uVar10 = 0x3c4;
            goto LAB_00210543;
          }
          if (local_60->id == local_6c) {
            lVar7 = (long)local_7c;
            lVar9 = -1;
            if (((-1 < lVar7) && (local_7c < local_78->max)) &&
               (lVar9 = local_78->global[lVar7], lVar9 < 0)) {
              lVar9 = -1;
            }
            local_50[lVar14] = lVar9;
            local_48[lVar14] = local_78->part[lVar7];
            pRVar1 = local_78->real;
            lVar9 = 0;
            do {
              pRVar6[lVar9] = pRVar1[local_7c * 0xf + lVar9];
              lVar9 = lVar9 + 1;
            } while (lVar9 != 0xf);
            iVar18 = local_78->naux;
            lVar9 = (long)iVar18;
            if (0 < lVar9) {
              pRVar1 = local_78->aux;
              lVar7 = 0;
              do {
                *(REF_DBL *)((long)local_68 + lVar7 * 8 + lVar15 * lVar9) =
                     pRVar1[local_7c * iVar18 + lVar7];
                lVar7 = lVar7 + 1;
              } while (lVar9 != lVar7);
            }
          }
        }
        lVar14 = lVar14 + 1;
        pRVar6 = pRVar6 + 0xf;
        lVar15 = lVar15 + 8;
        data = local_50;
      } while (lVar14 < ref_edge->n);
    }
  }
  else {
    uVar4 = local_78->naux * uVar4;
    if ((int)uVar4 < 0) {
      pcVar12 = "malloc edge_aux of REF_DBL negative";
      uVar10 = 0x3bf;
      goto LAB_00210135;
    }
    local_68 = (REF_DBL *)malloc((ulong)uVar4 << 3);
    if (local_68 == (REF_DBL *)0x0) {
      pcVar12 = "malloc edge_aux of REF_DBL NULL";
      uVar10 = 0x3bf;
      local_68 = (REF_DBL *)0x0;
      goto LAB_002102cb;
    }
    if (uVar13 != 0) {
      memset(local_68,0,(ulong)(uVar4 + (uVar4 == 0)) << 3);
      goto LAB_002102f3;
    }
  }
  pRVar11 = local_60;
  uVar4 = ref_edge_ghost_glob(ref_edge,local_60,data);
  if (uVar4 == 0) {
    uVar4 = ref_edge_ghost_int(ref_edge,pRVar11,local_48);
    if (uVar4 == 0) {
      uVar4 = ref_edge_ghost_dbl(ref_edge,pRVar11,local_58,0xf);
      if (uVar4 == 0) {
        local_50 = data;
        if ((local_78->naux < 1) ||
           (uVar4 = ref_edge_ghost_dbl(ref_edge,pRVar11,local_68,local_78->naux), uVar4 == 0)) {
          pRVar3 = local_78;
          if (0 < ref_edge->n) {
            pRVar11 = (REF_MPI)0x0;
            lVar14 = 0;
            pRVar6 = local_58;
            do {
              local_38 = local_50[lVar14];
              if (local_38 != -1) {
                local_60 = pRVar11;
                uVar4 = ref_node_add(pRVar3,local_38,&local_7c);
                if (uVar4 != 0) {
                  pcVar12 = "add node";
                  uVar10 = 0x3df;
                  goto LAB_00210543;
                }
                ref_subdiv->node[lVar14] = local_7c;
                pRVar3->part[local_7c] = local_48[lVar14];
                pRVar1 = pRVar3->real;
                lVar15 = 0;
                do {
                  pRVar1[(long)local_7c * 0xf + lVar15] = pRVar6[lVar15];
                  lVar15 = lVar15 + 1;
                } while (lVar15 != 0xf);
                lVar15 = (long)local_78->naux;
                pRVar11 = local_60;
                if (0 < lVar15) {
                  pRVar1 = local_78->aux;
                  lVar9 = 0;
                  do {
                    pRVar1[local_7c * lVar15 + lVar9] =
                         *(REF_DBL *)((long)local_68 + lVar9 * 8 + (long)local_60 * lVar15);
                    lVar9 = lVar9 + 1;
                  } while (lVar15 != lVar9);
                }
              }
              lVar14 = lVar14 + 1;
              pRVar6 = pRVar6 + 0xf;
              pRVar11 = (REF_MPI)&pRVar11->max_tag;
            } while (lVar14 < ref_edge->n);
          }
          uVar4 = ref_geom_ghost(local_40,local_78);
          if (uVar4 == 0) {
            if (local_68 != (REF_DBL *)0x0) {
              free(local_68);
            }
            free(local_58);
            free(local_48);
            free(local_50);
            return 0;
          }
          pcVar12 = "fill new node geom";
          uVar10 = 0x3eb;
        }
        else {
          pcVar12 = "aux ghost";
          uVar10 = 0x3d9;
        }
      }
      else {
        pcVar12 = "xyz ghost";
        uVar10 = 0x3d5;
      }
    }
    else {
      pcVar12 = "part ghost";
      uVar10 = 0x3d3;
    }
  }
  else {
    pcVar12 = "global ghost";
    uVar10 = 0x3d2;
  }
LAB_00210543:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",uVar10,
         "ref_subdiv_new_node",(ulong)uVar4,pcVar12);
  return uVar4;
}

Assistant:

REF_FCN static REF_STATUS ref_subdiv_new_node(REF_SUBDIV ref_subdiv) {
  REF_GRID ref_grid = ref_subdiv_grid(ref_subdiv);
  REF_NODE ref_node = ref_grid_node(ref_subdiv_grid(ref_subdiv));
  REF_EDGE ref_edge = ref_subdiv_edge(ref_subdiv);
  REF_MPI ref_mpi = ref_subdiv_mpi(ref_subdiv);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_INT edge, node, i;
  REF_GLOB global;
  REF_INT part;

  REF_GLOB *edge_global;
  REF_INT *edge_part;
  REF_DBL *edge_real;
  REF_DBL *edge_aux;

  /* remove previously created new_node that is unmarked */
  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    if (!ref_subdiv_mark(ref_subdiv, edge) &&
        REF_EMPTY != ref_subdiv_node(ref_subdiv, edge)) {
      node = ref_subdiv_node(ref_subdiv, edge);
      RSS(ref_geom_remove_all(ref_geom, node), "remove geom from node");
      RSS(ref_edge_part(ref_edge, edge, &part), "edge part");
      if (ref_mpi_rank(ref_mpi) == part) {
        RSS(ref_node_remove(ref_node, node), "owned, rm node with global");
      } else {
        RSS(ref_node_remove_without_global(ref_node, node),
            "ghost, rm node without global");
      }
      ref_subdiv_node(ref_subdiv, edge) = REF_EMPTY;
    }
  }

  RSS(ref_node_synchronize_globals(ref_node), "sync glob");

  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    if (ref_subdiv_mark(ref_subdiv, edge) &&
        REF_EMPTY == ref_subdiv_node(ref_subdiv, edge)) {
      RSS(ref_edge_part(ref_edge, edge, &part), "edge part");
      if (ref_mpi_rank(ref_mpi) == part) {
        RSS(ref_node_next_global(ref_node, &global), "next global");
        RSS(ref_node_add(ref_node, global, &node), "add node");
        ref_subdiv_node(ref_subdiv, edge) = node;
        RSS(ref_node_interpolate_edge(ref_node, ref_edge_e2n(ref_edge, 0, edge),
                                      ref_edge_e2n(ref_edge, 1, edge), 0.5,
                                      node),
            "new node");
        RSS(ref_geom_add_between(ref_grid, ref_edge_e2n(ref_edge, 0, edge),
                                 ref_edge_e2n(ref_edge, 1, edge), 0.5, node),
            "new node");
        RSS(ref_geom_constrain(ref_grid, node), "geom constraint");
        RSS(ref_metric_interpolate_between(
                ref_grid, ref_edge_e2n(ref_edge, 0, edge),
                ref_edge_e2n(ref_edge, 1, edge), node),
            "interp new metric");
      }
    }
  }

  RSS(ref_node_shift_new_globals(ref_node), "shift glob");

  ref_malloc_init(edge_global, ref_edge_n(ref_edge), REF_GLOB, REF_EMPTY);
  ref_malloc_init(edge_part, ref_edge_n(ref_edge), REF_INT, REF_EMPTY);
  ref_malloc_init(edge_real, REF_NODE_REAL_PER * ref_edge_n(ref_edge), REF_DBL,
                  -999.0);
  edge_aux = NULL;
  if (ref_node_naux(ref_node) > 0)
    ref_malloc_init(edge_aux, ref_node_naux(ref_node) * ref_edge_n(ref_edge),
                    REF_DBL, 0.0);

  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    node = ref_subdiv_node(ref_subdiv, edge);
    if (REF_EMPTY != node) {
      RSS(ref_edge_part(ref_edge, edge, &part), "edge part");
      if (ref_mpi_rank(ref_mpi) == part) {
        edge_global[edge] = ref_node_global(ref_node, node);
        edge_part[edge] = ref_node_part(ref_node, node);
        for (i = 0; i < REF_NODE_REAL_PER; i++)
          edge_real[i + REF_NODE_REAL_PER * edge] =
              ref_node_real(ref_node, i, node);
        for (i = 0; i < ref_node_naux(ref_node); i++)
          edge_aux[i + ref_node_naux(ref_node) * edge] =
              ref_node_aux(ref_node, i, node);
      }
    }
  }

  RSS(ref_edge_ghost_glob(ref_edge, ref_mpi, edge_global), "global ghost");
  RSS(ref_edge_ghost_int(ref_edge, ref_mpi, edge_part), "part ghost");
  RSS(ref_edge_ghost_dbl(ref_edge, ref_mpi, edge_real, REF_NODE_REAL_PER),
      "xyz ghost");
  if (ref_node_naux(ref_node) > 0)
    RSS(ref_edge_ghost_dbl(ref_edge, ref_mpi, edge_aux,
                           ref_node_naux(ref_node)),
        "aux ghost");

  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    global = edge_global[edge];
    if (REF_EMPTY != global) {
      /* finds local if already inserted */
      RSS(ref_node_add(ref_node, global, &node), "add node");
      ref_subdiv_node(ref_subdiv, edge) = node;
      ref_node_part(ref_node, node) = edge_part[edge];
      for (i = 0; i < REF_NODE_REAL_PER; i++)
        ref_node_real(ref_node, i, node) =
            edge_real[i + REF_NODE_REAL_PER * edge];
      for (i = 0; i < ref_node_naux(ref_node); i++)
        ref_node_aux(ref_node, i, node) =
            edge_aux[i + ref_node_naux(ref_node) * edge];
    }
  }

  RSS(ref_geom_ghost(ref_geom, ref_node), "fill new node geom");

  ref_free(edge_aux);
  ref_free(edge_real);
  ref_free(edge_part);
  ref_free(edge_global);

  return REF_SUCCESS;
}